

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall Generator::addEnums(Generator *this)

{
  QList<QByteArray> *vector;
  long lVar1;
  FILE *pFVar2;
  QArrayData *data;
  uint uVar3;
  EnumDef *pEVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  EnumDef *pEVar7;
  ulong uVar8;
  char *pcVar9;
  QByteArray *val;
  char *pcVar10;
  QByteArray *u;
  EnumDef *e;
  EnumDef *u_00;
  QByteArray *pQVar11;
  
  lVar1 = (this->cdef->super_BaseDef).enumList.d.size;
  if (lVar1 != 0) {
    u_00 = (this->cdef->super_BaseDef).enumList.d.ptr;
    pEVar4 = u_00 + lVar1;
    vector = &this->strings;
    do {
      pEVar7 = (EnumDef *)&u_00->enumName;
      if ((u_00->enumName).d.ptr == (char *)0x0) {
        pEVar7 = u_00;
      }
      pcVar9 = "flag";
      if (((u_00->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
           super_QFlagsStorage<QtMocConstants::EnumFlags>.i & 1) == 0) {
        pcVar9 = "enum";
      }
      pcVar10 = (u_00->name).d.ptr;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "";
      }
      pFVar2 = (FILE *)this->out;
      qVar5 = QtPrivate::indexOf<QByteArray,QByteArray>(vector,&u_00->name,0);
      qVar6 = QtPrivate::indexOf<QByteArray,QByteArray>(vector,&pEVar7->name,0);
      fprintf(pFVar2,"        // %s \'%s\'\n        QtMocHelpers::EnumData<%s>(%d, %d,",pcVar9,
              pcVar10,pcVar10,qVar5,(int)qVar6);
      uVar3 = (u_00->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
              super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
      if (uVar3 == 0) {
        fwrite(" QMC::EnumFlags{}",0x11,1,(FILE *)this->out);
      }
      else {
        pcVar9 = "";
        if ((uVar3 & 1) != 0) {
          fprintf((FILE *)this->out,"%s QMC::%s","","EnumIsFlag");
          uVar3 = (u_00->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
                  super_QFlagsStorage<QtMocConstants::EnumFlags>.i;
          pcVar9 = " |";
        }
        if ((uVar3 & 2) != 0) {
          fprintf((FILE *)this->out,"%s QMC::%s",pcVar9,"EnumIsScoped");
        }
      }
      if ((u_00->values).d.size == 0) {
        fwrite("),\n",3,1,(FILE *)this->out);
      }
      else {
        fwrite(").add({\n",8,1,(FILE *)this->out);
        pEVar7 = (EnumDef *)&u_00->enumName;
        if ((u_00->enumName).d.ptr == (char *)0x0) {
          pEVar7 = u_00;
        }
        data = &((pEVar7->name).d.d)->super_QArrayData;
        pcVar9 = (pEVar7->name).d.ptr;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar1 = (u_00->values).d.size;
        if (lVar1 != 0) {
          if (pcVar9 == (char *)0x0) {
            pcVar9 = "";
          }
          u = (u_00->values).d.ptr;
          pQVar11 = u + lVar1;
          do {
            pFVar2 = (FILE *)this->out;
            uVar8 = QtPrivate::indexOf<QByteArray,QByteArray>(vector,u,0);
            pcVar10 = (u->d).ptr;
            if (pcVar10 == (char *)0x0) {
              pcVar10 = "";
            }
            fprintf(pFVar2,"            { %4d, %s::%s },\n",uVar8 & 0xffffffff,pcVar9,pcVar10);
            u = u + 1;
          } while (u != pQVar11);
        }
        fwrite("        }),\n",0xc,1,(FILE *)this->out);
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,1,0x10);
          }
        }
      }
      u_00 = u_00 + 1;
    } while (u_00 != pEVar4);
  }
  return;
}

Assistant:

void Generator::addEnums()
{
    for (const EnumDef &e : std::as_const(cdef->enumList)) {
        const QByteArray &typeName = e.enumName.isNull() ? e.name : e.enumName;
        fprintf(out, "        // %s '%s'\n"
                     "        QtMocHelpers::EnumData<%s>(%d, %d,",
                e.flags & EnumIsFlag ? "flag" : "enum", e.name.constData(),
                e.name.constData(), stridx(e.name), stridx(typeName));

        if (e.flags) {
            const char *separator = "";
            auto addFlag = [this, &separator](const char *text) {
                fprintf(out, "%s QMC::%s", separator, text);
                separator = " |";
            };
            if (e.flags & EnumIsFlag)
                addFlag("EnumIsFlag");
            if (e.flags & EnumIsScoped)
                addFlag("EnumIsScoped");
        } else {
            fprintf(out, " QMC::EnumFlags{}");
        }

        if (e.values.isEmpty()) {
            fprintf(out, "),\n");
            continue;
        }

        // add the enumerations
        fprintf(out, ").add({\n");
        QByteArray prefix = (e.enumName.isNull() ? e.name : e.enumName);
        for (const QByteArray &val : e.values) {
            fprintf(out, "            { %4d, %s::%s },\n", stridx(val),
                    prefix.constData(), val.constData());
        }

        fprintf(out, "        }),\n");
    }
}